

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O0

int tnt_request_set_ops(tnt_request *req,tnt_stream *s)

{
  tnt_stream *s_local;
  tnt_request *req_local;
  
  if ((req->hdr).type == TNT_OP_UPDATE) {
    req->tuple = *s->data;
    req->tuple_end = req->tuple + *(long *)((long)s->data + 8);
    req_local._4_4_ = 0;
  }
  else if ((req->hdr).type == TNT_OP_UPSERT) {
    req->key = *s->data;
    req->key_end = req->key + *(long *)((long)s->data + 8);
    req_local._4_4_ = 0;
  }
  else {
    req_local._4_4_ = -1;
  }
  return req_local._4_4_;
}

Assistant:

int
tnt_request_set_ops(struct tnt_request *req, struct tnt_stream *s)
{
	if (req->hdr.type == TNT_OP_UPDATE) {
		req->tuple     = TNT_SBUF_DATA(s);
		req->tuple_end = req->tuple + TNT_SBUF_SIZE(s);
		return 0;
	} else if (req->hdr.type == TNT_OP_UPSERT) {
		req->key     = TNT_SBUF_DATA(s);
		req->key_end = req->key + TNT_SBUF_SIZE(s);
		return 0;
	}
	return -1;
}